

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1541.c
# Opt level: O0

int test(char *URL)

{
  int iVar1;
  char *pcVar2;
  int error;
  initurl url [67];
  CURLSH *share;
  int i;
  pthread_t tid [67];
  char *URL_local;
  
  tid[0x42] = (pthread_t)URL;
  curl_global_init(3);
  pcVar2 = (char *)curl_share_init();
  curl_share_setopt(pcVar2,3,lock_cb);
  curl_share_setopt(pcVar2,4,unlock_cb);
  curl_share_setopt(pcVar2,1,5);
  init_locks();
  for (share._4_4_ = 0; share._4_4_ < 0x43; share._4_4_ = share._4_4_ + 1) {
    *(pthread_t *)(&stack0xfffffffffffff778 + (long)share._4_4_ * 0x18) = tid[0x42];
    url[share._4_4_].url = pcVar2;
    *(int *)&url[share._4_4_].share = share._4_4_;
    iVar1 = pthread_create((pthread_t *)(&stack0xfffffffffffffdd8 + (long)share._4_4_ * 8),
                           (pthread_attr_t *)0x0,run_thread,
                           &stack0xfffffffffffff778 + (long)share._4_4_ * 0x18);
    if (iVar1 == 0) {
      curl_mfprintf(_stderr,"Thread %d, gets %s\n",share._4_4_,tid[0x42]);
    }
    else {
      curl_mfprintf(_stderr,"Couldn\'t run thread number %d, errno %d\n",share._4_4_,iVar1);
    }
  }
  for (share._4_4_ = 0; share._4_4_ < 0x43; share._4_4_ = share._4_4_ + 1) {
    pthread_join(*(pthread_t *)(&stack0xfffffffffffffdd8 + (long)share._4_4_ * 8),(void **)0x0);
    curl_mfprintf(_stderr,"Thread %d terminated\n",share._4_4_);
  }
  kill_locks();
  curl_share_cleanup(pcVar2);
  curl_global_cleanup();
  return 0;
}

Assistant:

int test(char *URL)
{
  pthread_t tid[NUM_THREADS];
  int i;
  CURLSH *share;
  struct initurl url[NUM_THREADS];

  /* Must initialize libcurl before any threads are started */
  curl_global_init(CURL_GLOBAL_ALL);

  share = curl_share_init();
  curl_share_setopt(share, CURLSHOPT_LOCKFUNC, lock_cb);
  curl_share_setopt(share, CURLSHOPT_UNLOCKFUNC, unlock_cb);
  curl_share_setopt(share, CURLSHOPT_SHARE, CURL_LOCK_DATA_CONNECT);

  init_locks();

  for(i = 0; i< NUM_THREADS; i++) {
    int error;
    url[i].url = URL;
    url[i].share = share;
    url[i].threadno = i;
    error = pthread_create(&tid[i], NULL, run_thread, &url[i]);
    if(0 != error)
      fprintf(stderr, "Couldn't run thread number %d, errno %d\n", i, error);
    else
      fprintf(stderr, "Thread %d, gets %s\n", i, URL);
  }

  /* now wait for all threads to terminate */
  for(i = 0; i< NUM_THREADS; i++) {
    pthread_join(tid[i], NULL);
    fprintf(stderr, "Thread %d terminated\n", i);
  }

  kill_locks();

  curl_share_cleanup(share);
  curl_global_cleanup();
  return 0;
}